

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkUifNodePairs(Wlc_Ntk_t *p,Vec_Int_t *vPairsInit)

{
  int iVar1;
  int iVar2;
  int FillOdd;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  int iFaninNew;
  int iFanin2;
  int iFanin;
  int iObjNew2;
  int iObjNew;
  int iObj2;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Vec_Int_t *vCompares;
  Vec_Int_t *vUifConstrs;
  Wlc_Obj_t *pObj2;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *vPairs;
  Vec_Int_t *vPairsInit_local;
  Wlc_Ntk_t *p_local;
  
  pNew = (Wlc_Ntk_t *)vPairsInit;
  if (vPairsInit == (Vec_Int_t *)0x0) {
    pNew = (Wlc_Ntk_t *)Wlc_NtkFindUifableMultiplierPairs(p);
  }
  if (pNew == (Wlc_Ntk_t *)0x0) {
    p_local = (Wlc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Vec_IntSize((Vec_Int_t *)pNew);
    if ((iVar1 < 1) || (iVar1 = Vec_IntSize((Vec_Int_t *)pNew), iVar1 % 2 != 0)) {
      __assert_fail("Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                    ,0xfa,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
    }
    p_00 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    p_02 = Vec_IntAlloc(100);
    for (iObj = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pNew), iObj + 1 < iVar1; iObj = iObj + 2) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,iObj);
      iVar3 = Vec_IntEntry((Vec_Int_t *)pNew,iObj + 1);
      pObj2 = Wlc_NtkObj(p,iVar1);
      pWVar4 = Wlc_NtkObj(p,iVar3);
      iVar2 = Wlc_NtkPairIsUifable(p,pObj2,pWVar4);
      if (iVar2 == 0) {
        __assert_fail("Wlc_NtkPairIsUifable(p, pObj, pObj2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x104,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      Vec_IntClear(p_01);
      for (iObj2 = 0; iVar2 = Wlc_ObjFaninNum(pObj2), iObj2 < iVar2; iObj2 = iObj2 + 1) {
        iVar2 = Wlc_ObjFaninId(pObj2,iObj2);
        FillOdd = Wlc_ObjFaninId(pWVar4,iObj2);
        Vec_IntFillTwo(p_00,2,iVar2,FillOdd);
        iVar2 = Wlc_ObjCreate(p,0x20,0,0,0,p_00);
        Vec_IntPush(p_01,iVar2);
        pObj2 = Wlc_NtkObj(p,iVar1);
      }
      iVar2 = Vec_IntSize(p_01);
      iVar2 = Wlc_ObjCreate(p,0x17,0,iVar2 + -1,0,p_01);
      Vec_IntFill(p_00,1,iVar2);
      iVar2 = Wlc_ObjCreate(p,0x26,0,0,0,p_00);
      Vec_IntFillTwo(p_00,2,iVar1,iVar3);
      iVar1 = Wlc_ObjCreate(p,0x1f,0,0,0,p_00);
      Vec_IntFillTwo(p_00,2,iVar2,iVar1);
      iVar1 = Wlc_ObjCreate(p,0x1d,0,0,0,p_00);
      Vec_IntPush(p_02,iVar1);
    }
    iVar1 = Vec_IntSize(p_02);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vUifConstrs) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                    ,0x120,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
    }
    iVar1 = Vec_IntSize(p_02);
    if (iVar1 == 1) {
      iFanin = Vec_IntEntry(p_02,0);
    }
    else {
      iVar1 = Vec_IntSize(p_02);
      iVar1 = Wlc_ObjCreate(p,0x17,0,iVar1 + -1,0,p_02);
      Vec_IntFill(p_00,1,iVar1);
      iFanin = Wlc_ObjCreate(p,0x25,0,0,0,p_00);
    }
    for (iObj = 0; iVar1 = Wlc_NtkPoNum(p), iObj < iVar1; iObj = iObj + 1) {
      pWVar4 = Wlc_NtkPo(p,iObj);
      iVar1 = Wlc_ObjId(p,pWVar4);
      Vec_IntFillTwo(p_00,2,iVar1,iFanin);
      iFanin = Wlc_ObjCreate(p,0x1c,0,0,0,p_00);
      pWVar4 = Wlc_NtkObj(p,iVar1);
      iVar3 = Vec_IntEntry(&p->vPos,iObj);
      if (iVar3 != iVar1) {
        __assert_fail("Vec_IntEntry(&p->vPos, i) == iObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x135,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      iVar3 = Vec_IntEntry(&p->vCos,iObj);
      if (iVar3 != iVar1) {
        __assert_fail("Vec_IntEntry(&p->vCos, i) == iObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x136,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      Vec_IntWriteEntry(&p->vPos,iObj,iFanin);
      Vec_IntWriteEntry(&p->vCos,iObj,iFanin);
      pWVar5 = Wlc_NtkObj(p,iFanin);
      *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xfdff | 0x200;
      if ((*(ushort *)pWVar4 >> 9 & 1) == 0) {
        __assert_fail("pObj->fIsPo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcUif.c"
                      ,0x13b,"Wlc_Ntk_t *Wlc_NtkUifNodePairs(Wlc_Ntk_t *, Vec_Int_t *)");
      }
      *(ushort *)pWVar4 = *(ushort *)pWVar4 & 0xfdff;
    }
    Vec_IntFree(p_02);
    Vec_IntFree(p_01);
    Vec_IntFree(p_00);
    if (pNew != (Wlc_Ntk_t *)vPairsInit) {
      Vec_IntFree((Vec_Int_t *)pNew);
    }
    p_local = Wlc_NtkDupDfs(p,0,1);
  }
  return p_local;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkUifNodePairs( Wlc_Ntk_t * p, Vec_Int_t * vPairsInit )
{
    Vec_Int_t * vPairs = vPairsInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObj2;
    Vec_Int_t * vUifConstrs, * vCompares, * vFanins;
    int i, k, iObj, iObj2, iObjNew, iObjNew2;
    int iFanin, iFanin2, iFaninNew;
    // get multiplier pairs if not given
    if ( vPairs == NULL )
        vPairs = Wlc_NtkFindUifableMultiplierPairs( p );
    if ( vPairs == NULL )
        return NULL;
    // sanity checks
    assert( Vec_IntSize(vPairs) > 0 && Vec_IntSize(vPairs) % 2 == 0 );
    // iterate through node pairs
    vFanins = Vec_IntAlloc( 100 );
    vCompares = Vec_IntAlloc( 100 );
    vUifConstrs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, iObj2, i )
    {
        // get two nodes
        pObj  = Wlc_NtkObj( p, iObj );
        pObj2 = Wlc_NtkObj( p, iObj2 );
        assert( Wlc_NtkPairIsUifable(p, pObj, pObj2) );
        // create fanin comparator nodes
        Vec_IntClear( vCompares );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            iFanin2 = Wlc_ObjFaninId( pObj2, k );
            Vec_IntFillTwo( vFanins, 2, iFanin, iFanin2 );
            iFaninNew = Wlc_ObjCreate( p, WLC_OBJ_COMP_NOTEQU, 0, 0, 0, vFanins );
            Vec_IntPush( vCompares, iFaninNew );
            // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
            // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
            pObj = Wlc_NtkObj( p, iObj );
        }
        // concatenate fanin comparators
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vCompares) - 1, 0, vCompares );
        // create reduction-OR node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_OR, 0, 0, 0, vFanins );
        // craete output comparator node
        Vec_IntFillTwo( vFanins, 2, iObj, iObj2 );
        iObjNew2 = Wlc_ObjCreate( p, WLC_OBJ_COMP_EQU, 0, 0, 0, vFanins );
        // create implication node (iObjNew is already complemented above)
        Vec_IntFillTwo( vFanins, 2, iObjNew, iObjNew2 );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_OR, 0, 0, 0, vFanins );
        // save the constraint
        Vec_IntPush( vUifConstrs, iObjNew );
    }
    // derive the AND of the UIF contraints
    assert( Vec_IntSize(vUifConstrs) > 0 );
    if ( Vec_IntSize(vUifConstrs) == 1 )
        iObjNew = Vec_IntEntry( vUifConstrs, 0 );
    else
    {
        // concatenate
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vUifConstrs) - 1, 0, vUifConstrs );
        // create reduction-AND node
        Vec_IntFill( vFanins, 1, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_REDUCT_AND, 0, 0, 0, vFanins );
    }
    // update each PO to point to the new node
    Wlc_NtkForEachPo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Vec_IntFillTwo( vFanins, 2, iObj, iObjNew );
        iObjNew = Wlc_ObjCreate( p, WLC_OBJ_LOGIC_AND, 0, 0, 0, vFanins );
        // note that a pointer to Wlc_Obj_t (for example, pObj) can be invalidated after a call to 
        // Wlc_ObjCreate() due to a possible realloc of the internal array of objects...
        pObj = Wlc_NtkObj( p, iObj );
        // update PO/CO arrays
        assert( Vec_IntEntry(&p->vPos, i) == iObj );
        assert( Vec_IntEntry(&p->vCos, i) == iObj );
        Vec_IntWriteEntry( &p->vPos, i, iObjNew );
        Vec_IntWriteEntry( &p->vCos, i, iObjNew );
        // transfer the PO attribute
        Wlc_NtkObj(p, iObjNew)->fIsPo = 1;
        assert( pObj->fIsPo );
        pObj->fIsPo = 0;
    }
    // cleanup
    Vec_IntFree( vUifConstrs );
    Vec_IntFree( vCompares );
    Vec_IntFree( vFanins );
    if ( vPairs != vPairsInit )
        Vec_IntFree( vPairs );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}